

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O2

void __thiscall
xray_re::xr_vbuf::load_ogf3(xr_vbuf *this,xr_reader *r,size_t n,ogf_vertex_format vf)

{
  uint16_t bone0;
  uint16_t bone1;
  float *pfVar1;
  uint32_t *puVar2;
  uint16_t *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  finfluence *pfVar8;
  fvector3 *pfVar9;
  fvector2 *pfVar10;
  ulong uVar11;
  long lVar12;
  size_t i;
  long lVar13;
  size_t sVar14;
  long local_38;
  
  if (vf == OGF3_VERTEXFORMAT_FVF_2L) {
    clear(this);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = n;
    uVar11 = SUB168(auVar6 * ZEXT816(0x24),0);
    if (SUB168(auVar6 * ZEXT816(0x24),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    pfVar8 = (finfluence *)operator_new__(uVar11);
    if (n != 0) {
      lVar13 = 0;
      do {
        _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::_svector
                  ((_svector<xray_re::_bone_weight<unsigned_int,_float>,_4U> *)
                   ((long)&(pfVar8->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).
                           array[0].bone + lVar13));
        lVar13 = lVar13 + 0x24;
      } while (n * 0x24 - lVar13 != 0);
    }
    auVar7._8_8_ = 0;
    auVar7._0_8_ = n;
    this->m_influences = pfVar8;
    uVar11 = 0xffffffffffffffff;
    if (SUB168(auVar7 * ZEXT816(0xc),8) == 0) {
      uVar11 = SUB168(auVar7 * ZEXT816(0xc),0);
    }
    pfVar9 = (fvector3 *)operator_new__(uVar11);
    this->m_points = pfVar9;
    pfVar9 = (fvector3 *)operator_new__(uVar11);
    this->m_normals = pfVar9;
    local_38 = 0;
    pfVar10 = (fvector2 *)operator_new__(-(ulong)(n >> 0x3d != 0) | n * 8);
    this->m_texcoords = pfVar10;
    (this->super_xr_flexbuf).m_size = n;
    lVar13 = 0;
    for (sVar14 = 0; n != sVar14; sVar14 = sVar14 + 1) {
      puVar3 = (r->field_2).m_p_u16;
      (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
      bone0 = *puVar3;
      (r->field_2).m_p = (uint8_t *)(puVar3 + 2);
      bone1 = puVar3[1];
      xr_reader::r_fvector3(r,(fvector3 *)((long)&this->m_points->field_0 + lVar13));
      xr_reader::r_fvector3(r,(fvector3 *)((long)&this->m_normals->field_0 + lVar13));
      xr_reader::advance(r,0x18);
      pfVar8 = this->m_influences;
      pfVar1 = (r->field_2).m_p_f;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      _influence<unsigned_int,_float>::set_wo_reorder
                ((_influence<unsigned_int,_float> *)
                 ((long)&(pfVar8->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).
                         array[0].bone + local_38),bone0,bone1,*pfVar1);
      pfVar10 = this->m_texcoords;
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      pfVar10[sVar14].field_0.field_0.x = *pfVar1;
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      pfVar10[sVar14].field_0.field_0.y = *pfVar1;
      lVar13 = lVar13 + 0xc;
      local_38 = local_38 + 0x24;
    }
  }
  else {
    if (vf != OGF3_VERTEXFORMAT_FVF_1L) {
      load_d3d7(this,r,n,vf);
      return;
    }
    clear(this);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = n;
    uVar11 = SUB168(auVar4 * ZEXT816(0x24),0);
    if (SUB168(auVar4 * ZEXT816(0x24),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    pfVar8 = (finfluence *)operator_new__(uVar11);
    if (n != 0) {
      lVar13 = 0;
      do {
        _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::_svector
                  ((_svector<xray_re::_bone_weight<unsigned_int,_float>,_4U> *)
                   ((long)&(pfVar8->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).
                           array[0].bone + lVar13));
        lVar13 = lVar13 + 0x24;
      } while (n * 0x24 - lVar13 != 0);
    }
    auVar5._8_8_ = 0;
    auVar5._0_8_ = n;
    this->m_influences = pfVar8;
    uVar11 = 0xffffffffffffffff;
    if (SUB168(auVar5 * ZEXT816(0xc),8) == 0) {
      uVar11 = SUB168(auVar5 * ZEXT816(0xc),0);
    }
    pfVar9 = (fvector3 *)operator_new__(uVar11);
    this->m_points = pfVar9;
    pfVar9 = (fvector3 *)operator_new__(uVar11);
    this->m_normals = pfVar9;
    lVar12 = 0;
    pfVar10 = (fvector2 *)operator_new__(-(ulong)(n >> 0x3d != 0) | n * 8);
    this->m_texcoords = pfVar10;
    (this->super_xr_flexbuf).m_size = n;
    lVar13 = 0;
    for (sVar14 = 0; n != sVar14; sVar14 = sVar14 + 1) {
      xr_reader::r_fvector3(r,(fvector3 *)((long)&this->m_points->field_0 + lVar13));
      xr_reader::r_fvector3(r,(fvector3 *)((long)&this->m_normals->field_0 + lVar13));
      pfVar10 = this->m_texcoords;
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      pfVar10[sVar14].field_0.field_0.x = *pfVar1;
      pfVar1 = (float *)(r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
      pfVar10[sVar14].field_0.field_0.y = *pfVar1;
      pfVar8 = this->m_influences;
      puVar2 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
      _influence<unsigned_int,_float>::set
                ((_influence<unsigned_int,_float> *)
                 ((long)&(pfVar8->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).
                         array[0].bone + lVar12),*puVar2);
      lVar13 = lVar13 + 0xc;
      lVar12 = lVar12 + 0x24;
    }
  }
  make_signature(this);
  return;
}

Assistant:

void xr_vbuf::load_ogf3(xr_reader& r, size_t n, ogf_vertex_format vf)
{
	if (vf == OGF3_VERTEXFORMAT_FVF_1L) {
		clear();
		m_influences = new finfluence[n];
		m_points = new fvector3[n];
		m_normals = new fvector3[n];
		m_texcoords = new fvector2[n];
		set_size(n);
		for (size_t i = 0; i != n; ++i) {
			r.r_fvector3(m_points[i]);
			r.r_fvector3(m_normals[i]);
			r.r_fvector2(m_texcoords[i]);
			m_influences[i].set(r.r_u32());
		}
		make_signature();
	} else if (vf == OGF3_VERTEXFORMAT_FVF_2L) {
		clear();
		m_influences = new finfluence[n];
		m_points = new fvector3[n];
		m_normals = new fvector3[n];
		m_texcoords = new fvector2[n];
		set_size(n);
		for (size_t i = 0; i != n; ++i) {
			uint16_t bone0 = r.r_u16();
			uint16_t bone1 = r.r_u16();
			r.r_fvector3(m_points[i]);
			r.r_fvector3(m_normals[i]);
			r.advance(2*sizeof(fvector3));	// skip tangent and binormal
			m_influences[i].set_wo_reorder(bone0, bone1, r.r_float());//set_wo_reorder ����� ��� �������������� ������
			r.r_fvector2(m_texcoords[i]);
		}
		make_signature();
	} else {
		load_d3d7(r, n, vf);
	}
}